

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldpc.c
# Opt level: O2

void ldpc_generate_mat(m256v *L,parameters *P)

{
  int iVar1;
  ulong uVar2;
  int i_1;
  long lVar3;
  int i;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  m256v_clear(L);
  for (uVar4 = 0; (long)uVar4 < (long)P->B; uVar4 = uVar4 + 1) {
    iVar1 = P->S;
    uVar5 = (ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff;
    uVar2 = (long)uVar5 % (long)iVar1;
    L->e[uVar4 + L->rstride * (uVar2 & 0xffffffff)] = '\x01';
    iVar1 = (int)((long)uVar5 / (long)iVar1);
    iVar6 = ((int)uVar2 + iVar1 + 1) % P->S;
    L->e[uVar4 + L->rstride * (long)iVar6] = '\x01';
    L->e[uVar4 + (long)((iVar6 + iVar1 + 1) % P->S) * L->rstride] = '\x01';
  }
  for (lVar3 = 0; uVar4 = (ulong)P->S, lVar3 < (long)uVar4; lVar3 = lVar3 + 1) {
    L->e[P->B + lVar3 + L->rstride * lVar3] = '\x01';
  }
  uVar5 = 0;
  while ((long)uVar5 < (long)(int)uVar4) {
    iVar1 = P->P;
    uVar2 = uVar5 + 1;
    L->e[(long)(int)((long)((ulong)(uint)((int)uVar5 >> 0x1f) << 0x20 | uVar5 & 0xffffffff) %
                    (long)iVar1) + (long)P->W + L->rstride * uVar5] = '\x01';
    L->e[(long)(int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) %
                    (long)iVar1) + (long)P->W + uVar5 * L->rstride] = '\x01';
    uVar5 = uVar2;
    uVar4 = (ulong)(uint)P->S;
  }
  return;
}

Assistant:

void ldpc_generate_mat(m256v* L, const parameters* P)
{
	assert(L->n_row == P->S);
	assert(L->n_col == P->L);

	m256v_clear(L);

	/* Fill in the left part (G_LDPC,1) */
	for (int i = 0; i < P->B; ++i) {
		const int a = 1 + i / P->S;
		int b = i % P->S;
		m256v_set_el(L, b, i, 1);
		b = (b + a) % P->S;
		m256v_set_el(L, b, i, 1);
		b = (b + a) % P->S;
		m256v_set_el(L, b, i, 1);
	}

	/* Add diagonal at offset B */
	for (int i = 0; i < P->S; ++i) {
		m256v_set_el(L, i, i + P->B, 1);
	}

	/* Double diagonal on the right (G_LDPC,2) */
	for (int i = 0; i < P->S; ++i) {
		const int a = i % P->P;
		const int b = (i + 1) % P->P;
		m256v_set_el(L, i, P->W + a, 1);
		m256v_set_el(L, i, P->W + b, 1);
	}
}